

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding
          (ConvertToSampledImagePass *this,Instruction *inst,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  Instruction *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  IRContext *this_01;
  DecorationManager *this_02;
  reference ppIVar5;
  Decoration decoration;
  Instruction *decorate;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  bool found_binding_to_convert;
  bool found_descriptor_set_to_convert;
  DecorationManager *decoration_manager;
  DescriptorSetAndBinding *descriptor_set_binding_local;
  Instruction *inst_local;
  ConvertToSampledImagePass *this_local;
  
  this_01 = Pass::context(&this->super_Pass);
  this_02 = IRContext::get_decoration_mgr(this_01);
  bVar2 = false;
  bVar1 = false;
  uVar4 = opt::Instruction::result_id(inst);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2,this_02,uVar4,false);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  decorate = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__begin2);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&decorate);
    if (!bVar3) {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__begin2);
      bVar3 = false;
      if (bVar2) {
        bVar3 = bVar1;
      }
      return bVar3;
    }
    ppIVar5 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppIVar5;
    uVar4 = opt::Instruction::GetSingleWordInOperand(this_00,1);
    if (uVar4 == 0x22) {
      if (bVar2) {
        __assert_fail("false && \"A resource has two OpDecorate for the descriptor set\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                      ,0x5d,
                      "bool spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding(const Instruction &, DescriptorSetAndBinding *) const"
                     );
      }
      uVar4 = opt::Instruction::GetSingleWordInOperand(this_00,2);
      descriptor_set_binding->descriptor_set = uVar4;
      bVar2 = true;
    }
    else if (uVar4 == 0x21) {
      if (bVar1 != false) {
        __assert_fail("false && \"A resource has two OpDecorate for the binding\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                      ,0x65,
                      "bool spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding(const Instruction &, DescriptorSetAndBinding *) const"
                     );
      }
      uVar4 = opt::Instruction::GetSingleWordInOperand(this_00,2);
      descriptor_set_binding->binding = uVar4;
      bVar1 = true;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ConvertToSampledImagePass::GetDescriptorSetBinding(
    const Instruction& inst,
    DescriptorSetAndBinding* descriptor_set_binding) const {
  auto* decoration_manager = context()->get_decoration_mgr();
  bool found_descriptor_set_to_convert = false;
  bool found_binding_to_convert = false;
  for (auto decorate :
       decoration_manager->GetDecorationsFor(inst.result_id(), false)) {
    spv::Decoration decoration =
        spv::Decoration(decorate->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::DescriptorSet) {
      if (found_descriptor_set_to_convert) {
        assert(false && "A resource has two OpDecorate for the descriptor set");
        return false;
      }
      descriptor_set_binding->descriptor_set =
          decorate->GetSingleWordInOperand(2u);
      found_descriptor_set_to_convert = true;
    } else if (decoration == spv::Decoration::Binding) {
      if (found_binding_to_convert) {
        assert(false && "A resource has two OpDecorate for the binding");
        return false;
      }
      descriptor_set_binding->binding = decorate->GetSingleWordInOperand(2u);
      found_binding_to_convert = true;
    }
  }
  return found_descriptor_set_to_convert && found_binding_to_convert;
}